

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

void test_recv_impl(char *file,int line,int sock,char *data)

{
  uint uVar1;
  int iVar2;
  uint extraout_EAX;
  size_t __n;
  void *__s2;
  undefined4 in_register_00000014;
  
  __n = strlen((char *)CONCAT44(in_register_00000014,sock));
  __s2 = malloc(__n + 1);
  if (__s2 == (void *)0x0) {
    test_recv_impl_cold_3();
  }
  else {
    uVar1 = nn_recv(line,__s2,__n + 1,0);
    if (-1 < (int)uVar1) {
      if (uVar1 == (uint)__n) {
        iVar2 = bcmp((char *)CONCAT44(in_register_00000014,sock),__s2,__n);
        if (iVar2 == 0) {
          free(__s2);
          return;
        }
        test_recv_impl_cold_1();
      }
      goto LAB_00102185;
    }
  }
  test_recv_impl_cold_2();
  uVar1 = extraout_EAX;
LAB_00102185:
  fprintf(_stderr,"Received data has wrong length: %d != %d (%s:%d)\n",(ulong)uVar1,__n & 0xffffffff
          ,"/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/inproc.c",
          (ulong)file & 0xffffffff);
  nn_err_abort();
}

Assistant:

static void NN_UNUSED test_recv_impl (char *file, int line, int sock, char *data)
{
    size_t data_len;
    int rc;
    char *buf;

    data_len = strlen (data);
    /*  We allocate plus one byte so that we are sure that message received
        has correct length and not truncated  */
    buf = malloc (data_len+1);
    alloc_assert (buf);

    rc = nn_recv (sock, buf, data_len+1, 0);
    if (rc < 0) {
        fprintf (stderr, "Failed to recv: %s [%d] (%s:%d)\n",
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    if (rc != (int)data_len) {
        fprintf (stderr, "Received data has wrong length: %d != %d (%s:%d)\n",
            rc, (int) data_len,
            file, line);
        nn_err_abort ();
    }
    if (memcmp (data, buf, data_len) != 0) {
        /*  We don't print the data as it may have binary garbage  */
        fprintf (stderr, "Received data is wrong (%s:%d)\n", file, line);
        nn_err_abort ();
    }

    free (buf);
}